

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_add_range(void **param_1)

{
  ulong uVar1;
  bool bVar2;
  uint64_t v;
  ulong uVar3;
  pointer ppVar4;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> __l;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ranges;
  Roaring r2;
  Roaring r1;
  
  r1.roaring.high_low_container.size = 1;
  r1.roaring.high_low_container.allocation_size = 0;
  r1.roaring.high_low_container.containers = (container_s **)0x5;
  r1.roaring.high_low_container.keys = (uint16_t *)0x1;
  r1.roaring.high_low_container.typecodes = (uint8_t *)0x1;
  r1.roaring.high_low_container.flags = '\x02';
  r1.roaring.high_low_container._33_7_ = 0;
  __l._M_len = 3;
  __l._M_array = (iterator)&r1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&ranges,__l,(allocator_type *)&r2);
  for (ppVar4 = ranges.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 != ranges.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
    uVar3 = ppVar4->first;
    uVar1 = ppVar4->second;
    roaring::Roaring::Roaring(&r1);
    roaring::Roaring::addRangeClosed(&r1,(uint32_t)uVar3,(uint32_t)uVar1);
    roaring::Roaring::Roaring(&r2);
    for (; uVar3 <= uVar1; uVar3 = uVar3 + 1) {
      roaring::Roaring::add(&r2,(uint32_t)uVar3);
    }
    bVar2 = roaring::Roaring::operator==(&r1,&r2);
    _assert_true((ulong)bVar2,"r1 == r2",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2ec);
    roaring::Roaring::~Roaring(&r2);
    roaring::Roaring::~Roaring(&r1);
  }
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&ranges.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_range) {
    std::vector<std::pair<uint64_t, uint64_t>> ranges = {
        {1, 5},
        {1, 1},
        {2, 1},
    };
    for (const auto &range : ranges) {
        uint64_t min = range.first;
        uint64_t max = range.second;
        Roaring r1;
        r1.addRangeClosed(min, max);
        Roaring r2;
        for (uint64_t v = min; v <= max; ++v) {
            r2.add(v);
        }
        assert_true(r1 == r2);
    }
}